

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_socketpair(void)

{
  int iVar1;
  uint child_pid;
  __pid_t child_pid_00;
  uint uVar2;
  ssize_t sVar3;
  undefined8 uVar4;
  uint extraout_EDX;
  undefined1 *unaff_RBX;
  undefined1 *puVar5;
  undefined1 *puVar6;
  int socket_fds [2];
  uv_poll_t poll_handle;
  undefined1 uStack_189;
  int iStack_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  undefined1 auStack_178 [160];
  code *pcStack_d8;
  undefined1 *puStack_c8;
  int local_b0;
  uint local_ac;
  undefined1 local_a8 [160];
  
  run_timer_loop_once();
  puVar6 = (undefined1 *)0x1;
  uVar2 = 1;
  iVar1 = socketpair(1,1,0,&local_b0);
  if (iVar1 == 0) {
    puVar6 = (undefined1 *)uv_default_loop();
    puVar5 = local_a8;
    iVar1 = uv_poll_init(puVar6,puVar5,local_b0);
    uVar2 = (uint)puVar5;
    if (iVar1 != 0) goto LAB_00157882;
    child_pid = fork();
    if (child_pid != 0) {
      unaff_RBX = (undefined1 *)(ulong)child_pid;
      if (child_pid == 0xffffffff) goto LAB_0015788c;
      puVar6 = (undefined1 *)(ulong)local_ac;
      uVar2 = 0x1918d0;
      sVar3 = send(local_ac,"hi\n",3,0);
      if (sVar3 == 3) {
        assert_wait_child(child_pid);
LAB_00157839:
        unaff_RBX = (undefined1 *)uv_default_loop();
        uv_walk(unaff_RBX,close_walk_cb,0);
        uVar2 = 0;
        uv_run(unaff_RBX);
        puVar6 = (undefined1 *)uv_default_loop();
        iVar1 = uv_loop_close();
        if (iVar1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        goto LAB_00157887;
      }
      goto LAB_00157891;
    }
    puVar6 = (undefined1 *)uv_default_loop();
    iVar1 = uv_loop_fork();
    if (iVar1 != 0) goto LAB_00157896;
    if (socket_cb_called != 0) goto LAB_0015789b;
    puVar6 = local_a8;
    uVar2 = 1;
    iVar1 = uv_poll_start(puVar6,1,socket_cb);
    if (iVar1 != 0) goto LAB_001578a0;
    puts("Going to run the loop in the child");
    puVar6 = (undefined1 *)uv_default_loop();
    uVar2 = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_001578a5;
    if (socket_cb_called == 1) goto LAB_00157839;
  }
  else {
    run_test_fork_socketpair_cold_1();
LAB_00157882:
    run_test_fork_socketpair_cold_2();
LAB_00157887:
    run_test_fork_socketpair_cold_10();
LAB_0015788c:
    run_test_fork_socketpair_cold_8();
LAB_00157891:
    run_test_fork_socketpair_cold_9();
LAB_00157896:
    run_test_fork_socketpair_cold_3();
LAB_0015789b:
    run_test_fork_socketpair_cold_4();
LAB_001578a0:
    run_test_fork_socketpair_cold_5();
LAB_001578a5:
    run_test_fork_socketpair_cold_6();
  }
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_c8 = unaff_RBX;
  if (uVar2 == 0) {
    pcStack_d8 = (code *)0x1578d1;
    uVar2 = extraout_EDX;
    printf("Socket cb got events %d\n");
    unaff_RBX = puVar6;
    if ((extraout_EDX & 1) == 0) goto LAB_0015791d;
    if (socket_cb_read_fd == 0) {
LAB_00157908:
      iVar1 = uv_close(puVar6,0);
      return iVar1;
    }
    uVar2 = 0x2f5700;
    pcStack_d8 = (code *)0x1578f8;
    sVar3 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar3 == (ulong)socket_cb_read_size * 3) goto LAB_00157908;
  }
  else {
    pcStack_d8 = (code *)0x15791d;
    socket_cb_cold_1();
LAB_0015791d:
    pcStack_d8 = (code *)0x157922;
    socket_cb_cold_3();
  }
  pcStack_d8 = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  pcStack_d8 = (code *)unaff_RBX;
  iVar1 = pipe(&iStack_180);
  if (iVar1 == 0) {
    run_timer_loop_once();
    uVar2 = 1;
    iVar1 = socketpair(1,1,0,&iStack_188);
    if (iVar1 != 0) goto LAB_00157b88;
    uVar4 = uv_default_loop();
    puVar6 = auStack_178;
    iVar1 = uv_poll_init(uVar4,puVar6,iStack_188);
    uVar2 = (uint)puVar6;
    if (iVar1 != 0) goto LAB_00157b8d;
    uVar2 = 1;
    iVar1 = uv_poll_start(auStack_178,1,socket_cb);
    if (iVar1 != 0) goto LAB_00157b92;
    uVar4 = uv_default_loop();
    uVar2 = 2;
    iVar1 = uv_run(uVar4);
    if (iVar1 != 1) goto LAB_00157b97;
    child_pid_00 = fork();
    if (child_pid_00 != 0) {
      if (child_pid_00 == -1) goto LAB_00157ba1;
      iVar1 = uv_poll_stop(auStack_178);
      if (iVar1 != 0) goto LAB_00157ba6;
      uv_close(auStack_178);
      uVar4 = uv_default_loop();
      uVar2 = 0;
      iVar1 = uv_run(uVar4);
      if (iVar1 != 0) goto LAB_00157bb0;
      if (socket_cb_called != 0) goto LAB_00157bba;
      uVar2 = 0x1923f5;
      sVar3 = write(iStack_17c,"1",1);
      if (sVar3 != 1) goto LAB_00157bc4;
      uVar2 = 0x1918d0;
      sVar3 = send(iStack_184,"hi\n",3,0);
      if (sVar3 != 3) goto LAB_00157bce;
      uVar4 = uv_default_loop();
      uVar2 = 0;
      iVar1 = uv_run(uVar4);
      if (iVar1 == 0) {
        if (socket_cb_called != 0) goto LAB_00157be2;
        assert_wait_child(child_pid_00);
        goto LAB_00157b3f;
      }
      goto LAB_00157bd8;
    }
    uVar2 = getpid();
    printf("Child is %d\n",(ulong)uVar2);
    puVar6 = &uStack_189;
    sVar3 = read(iStack_180,puVar6,1);
    uVar2 = (uint)puVar6;
    if (sVar3 != 1) goto LAB_00157bab;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar4);
    if (iVar1 != 0) goto LAB_00157bb5;
    if (socket_cb_called != 0) goto LAB_00157bbf;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_188;
    socket_cb_read_size = 1;
    uVar4 = uv_default_loop();
    uVar2 = 0;
    iVar1 = uv_run(uVar4);
    if (iVar1 != 0) goto LAB_00157bc9;
    if (socket_cb_called != 1) goto LAB_00157bd3;
    uVar2 = 0x2f5700;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_00157b3f:
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uVar2 = 0;
      uv_run(uVar4);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00157b9c;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_00157b88:
    run_test_fork_socketpair_started_cold_2();
LAB_00157b8d:
    run_test_fork_socketpair_started_cold_3();
LAB_00157b92:
    run_test_fork_socketpair_started_cold_4();
LAB_00157b97:
    run_test_fork_socketpair_started_cold_5();
LAB_00157b9c:
    run_test_fork_socketpair_started_cold_20();
LAB_00157ba1:
    run_test_fork_socketpair_started_cold_12();
LAB_00157ba6:
    run_test_fork_socketpair_started_cold_13();
LAB_00157bab:
    run_test_fork_socketpair_started_cold_6();
LAB_00157bb0:
    run_test_fork_socketpair_started_cold_14();
LAB_00157bb5:
    run_test_fork_socketpair_started_cold_7();
LAB_00157bba:
    run_test_fork_socketpair_started_cold_15();
LAB_00157bbf:
    run_test_fork_socketpair_started_cold_8();
LAB_00157bc4:
    run_test_fork_socketpair_started_cold_16();
LAB_00157bc9:
    run_test_fork_socketpair_started_cold_9();
LAB_00157bce:
    run_test_fork_socketpair_started_cold_17();
LAB_00157bd3:
    run_test_fork_socketpair_started_cold_10();
LAB_00157bd8:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_00157be2:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar2;
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(fork_socketpair) {
  /* A socket opened in the parent and accept'd in the
     child works after a fork. */
  pid_t child_pid;
  int socket_fds[2];
  uv_poll_t poll_handle;

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds));

  /* Create the server watcher in the parent, use it in the child. */
  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0]));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(3 == send(socket_fds[1], "hi\n", 3, 0));
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(0 == socket_cb_called);
    ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb));
    printf("Going to run the loop in the child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(1 == socket_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}